

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<long,unsigned_long>
          (BaseAppender *this,Vector *col,long input)

{
  unsigned_long uVar1;
  
  uVar1 = Cast::Operation<long,unsigned_long>(input);
  *(unsigned_long *)(col->data + (this->chunk).count * 8) = uVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}